

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result wabt::ValidateModule(Module *module,Errors *errors,ValidateOptions *options)

{
  Result RVar1;
  Validator validator;
  Validator local_2b0;
  
  anon_unknown_4::Validator::Validator(&local_2b0,errors,module,options);
  RVar1 = anon_unknown_4::Validator::CheckModule(&local_2b0);
  anon_unknown_4::Validator::~Validator(&local_2b0);
  return (Result)RVar1.enum_;
}

Assistant:

Result ValidateModule(const Module* module,
                      Errors* errors,
                      const ValidateOptions& options) {
  Validator validator(errors, module, options);

  return validator.CheckModule();
}